

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libj1939.c
# Opt level: O3

int libj1939_ifindex(char *str)

{
  uint uVar1;
  uint uVar2;
  if_nameindex *piVar3;
  if_nameindex *piVar4;
  int iVar5;
  long lVar6;
  undefined4 uVar7;
  undefined2 *puVar8;
  char **ppcVar9;
  char *pcVar10;
  char *endp;
  char *local_30 [6];
  
  while( true ) {
    piVar4 = saved;
    lVar6 = strtol(str,local_30,0);
    if (*local_30[0] == '\0') {
      return (int)lVar6;
    }
    if ((saved == (if_nameindex *)0x0) &&
       (saved = (if_nameindex *)if_nameindex(), saved == (if_nameindex *)0x0)) break;
    piVar3 = saved;
    uVar1 = saved->if_index;
    if (uVar1 != 0) {
      iVar5 = strcmp(saved->if_name,str);
      if (iVar5 == 0) {
        return uVar1;
      }
      ppcVar9 = &piVar3[1].if_name;
      while (uVar1 = ((if_nameindex *)(ppcVar9 + -1))->if_index, uVar1 != 0) {
        iVar5 = strcmp(*ppcVar9,str);
        ppcVar9 = ppcVar9 + 2;
        if (iVar5 == 0) {
          return uVar1;
        }
      }
    }
    if (piVar4 == (if_nameindex *)0x0) {
      return 0;
    }
    if_freenameindex((if_nameindex *)piVar3);
    saved = (if_nameindex *)0x0;
  }
  lVar6 = 1;
  err(1,"if_nameindex()");
  uVar1 = *(uint *)(lVar6 + 4);
  if (uVar1 == 0) {
    pcVar10 = libj1939_addr2str::buf;
  }
  else {
    while( true ) {
      piVar4 = saved;
      if ((saved == (if_nameindex *)0x0) &&
         (saved = (if_nameindex *)if_nameindex(), saved == (if_nameindex *)0x0)) {
        uVar7 = 0x109ac4;
        puVar8 = (undefined2 *)0x1;
        iVar5 = err();
        *puVar8 = 0x1d;
        *(undefined1 *)(puVar8 + 10) = 0xff;
        *(undefined8 *)(puVar8 + 4) = 0;
        *(undefined4 *)(puVar8 + 8) = uVar7;
        return iVar5;
      }
      uVar2 = saved->if_index;
      piVar3 = saved;
      while (uVar2 != 0) {
        if (uVar2 == uVar1) {
          if (piVar3->if_name == (char *)0x0) goto LAB_00107612;
          iVar5 = sprintf(libj1939_addr2str::buf,"%s:");
          goto LAB_0010762a;
        }
        uVar2 = piVar3[1].if_index;
        piVar3 = piVar3 + 1;
      }
      if (piVar4 == (if_nameindex *)0x0) break;
      if_freenameindex((if_nameindex *)saved);
      saved = (if_nameindex *)0x0;
    }
LAB_00107612:
    iVar5 = sprintf(libj1939_addr2str::buf,"#%i:",(ulong)*(uint *)(lVar6 + 4));
LAB_0010762a:
    pcVar10 = libj1939_addr2str::buf + iVar5;
  }
  if (*(long *)(lVar6 + 8) == 0) {
    if (*(char *)(lVar6 + 0x14) == -1) {
      pcVar10[0] = '-';
      pcVar10[1] = '\0';
      pcVar10 = pcVar10 + 1;
    }
    else {
      iVar5 = sprintf(pcVar10,"%02x");
      pcVar10 = pcVar10 + iVar5;
    }
  }
  else {
    iVar5 = sprintf(pcVar10,"%016llx");
    pcVar10 = pcVar10 + iVar5;
    if (*(int *)(lVar6 + 0x10) == 0xee00) {
      iVar5 = sprintf(pcVar10,".%02x",(ulong)*(byte *)(lVar6 + 0x14));
      pcVar10 = pcVar10 + iVar5;
    }
  }
  if (*(uint *)(lVar6 + 0x10) < 0x40000) {
    sprintf(pcVar10,",%05x");
  }
  return 0x10c300;
}

Assistant:

static int libj1939_ifindex(const char *str)
{
	const struct if_nameindex *lp, *cached = saved;
	char *endp;
	int ret;

	ret = strtol(str, &endp, 0);
	if (!*endp)
		/* did some good parse */
		return ret;

	fetch_names();
	for (lp = saved; lp->if_index; ++lp) {
		if (!strcmp(lp->if_name, str))
			return lp->if_index;
	}
	if (cached) {
		libj1939_cleanup();
		return libj1939_ifindex(str);
	}
	return 0;
}